

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

_func_void * __thiscall
boost::ext::ut::v1_1_8::detail::test::operator=<>(test *this,test_location<void_(*)()> test)

{
  test<void_(*)(),_boost::ext::ut::v1_1_8::none> local_68;
  test *local_10;
  test *this_local;
  
  local_68.type.data_ = (this->type).data_;
  local_68.type.size_ = (this->type).size_;
  local_68.name.data_ = (this->name).data_;
  local_68.name.size_ = (this->name).size_;
  local_10 = this;
  std::
  vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::vector(&local_68.tag,&this->tag);
  local_68.location.line_ = test.location.line_;
  local_68.location.file_ = test.location.file_;
  local_68.run = test.test;
  on<,boost::ext::ut::v1_1_8::events::test<void(*)(),boost::ext::ut::v1_1_8::none>>(&local_68);
  events::test<void_(*)(),_boost::ext::ut::v1_1_8::none>::~test(&local_68);
  return test.test;
}

Assistant:

constexpr auto operator=(test_location<void (*)()> test) {
      on<Ts...>(events::test<void (*)()>{.type = type,
                                         .name = name,
                                         .tag = tag,
                                         .location = test.location,
                                         .arg = none{},
                                         .run = test.test});
      return test.test;
    }